

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCode.cpp
# Opt level: O2

bool __thiscall Imf_3_4::KeyCode::operator==(KeyCode *this,KeyCode *other)

{
  int iVar1;
  
  iVar1 = memcmp(this,other,0x1c);
  return iVar1 == 0;
}

Assistant:

bool
KeyCode::operator== (const KeyCode& other) const
{
    return (_filmMfcCode   == other._filmMfcCode &&
            _filmType      == other._filmType &&
            _prefix        == other._prefix &&
            _count         == other._count &&
            _perfOffset    == other._perfOffset &&
            _perfsPerFrame == other._perfsPerFrame &&
            _perfsPerCount == other._perfsPerCount);
}